

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O0

box3f * __thiscall pbrt::Curve::getPrimBounds(Curve *this,size_t param_2)

{
  bool bVar1;
  reference pvVar2;
  float *pfVar3;
  long in_RSI;
  box3f *in_RDI;
  vec3f vVar4;
  vec3f maxWidth;
  vec3f p;
  iterator __end1;
  iterator __begin1;
  vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_> *__range1;
  vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_> *in_stack_ffffffffffffff58;
  __normal_iterator<pbrt::math::vec3f_*,_std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>_>
  *in_stack_ffffffffffffff60;
  box3f *a;
  undefined8 local_80;
  float local_78;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  box3f *in_stack_ffffffffffffffa0;
  float local_58;
  vec3f local_40;
  undefined8 local_34;
  float local_2c;
  vec3f *local_28;
  __normal_iterator<pbrt::math::vec3f_*,_std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>_>
  local_20;
  long local_18;
  
  a = in_RDI;
  math::box3f::empty_box();
  local_18 = in_RSI + 0xa8;
  local_20._M_current =
       (vec3f *)std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>::begin
                          (in_stack_ffffffffffffff58);
  local_28 = (vec3f *)std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>::end
                                (in_stack_ffffffffffffff58);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffff60,
                       (__normal_iterator<pbrt::math::vec3f_*,_std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>_>
                        *)in_stack_ffffffffffffff58);
    if (!bVar1) break;
    pvVar2 = __gnu_cxx::
             __normal_iterator<pbrt::math::vec3f_*,_std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>_>
             ::operator*(&local_20);
    local_34._0_4_ = pvVar2->x;
    local_34._4_4_ = pvVar2->y;
    local_2c = pvVar2->z;
    math::box3f::extend(in_stack_ffffffffffffffa0,
                        (vec3f *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    __gnu_cxx::
    __normal_iterator<pbrt::math::vec3f_*,_std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>_>
    ::operator++(&local_20);
  }
  pfVar3 = std::max<float>((float *)(in_RSI + 0xc0),(float *)(in_RSI + 0xc4));
  math::vec3f::vec3f(&local_40,*pfVar3);
  vVar4 = math::operator-(&a->lower,&in_RDI->lower);
  local_58 = vVar4.z;
  (in_RDI->lower).z = local_58;
  (in_RDI->lower).x = (float)(int)vVar4._0_8_;
  (in_RDI->lower).y = (float)(int)((ulong)vVar4._0_8_ >> 0x20);
  vVar4 = math::operator+(&a->lower,&in_RDI->lower);
  local_80 = vVar4._0_8_;
  local_78 = vVar4.z;
  (in_RDI->upper).x = (float)(undefined4)local_80;
  (in_RDI->upper).y = (float)local_80._4_4_;
  (in_RDI->upper).z = local_78;
  return a;
}

Assistant:

box3f Curve::getPrimBounds(const size_t /*unused: primID */) 
  {
    box3f primBounds = box3f::empty_box();
    for (auto p : P)
      primBounds.extend(p);
    vec3f maxWidth = vec3f(std::max(width0,width1));
    primBounds.lower = primBounds.lower - maxWidth;
    primBounds.upper = primBounds.upper + maxWidth;
    return primBounds;
  }